

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerHLSL::emit_struct_member
          (CompilerHLSL *this,SPIRType *type,uint32_t member_type_id,uint32_t index,
          string *qualifier,uint32_t base_offset)

{
  ID *__k;
  StorageClass SVar1;
  Decoration *pDVar2;
  bool bVar3;
  uint uVar4;
  SPIRType *pSVar5;
  mapped_type *pmVar6;
  runtime_error *this_00;
  Bitset *pBVar7;
  undefined4 in_register_0000008c;
  char (*ts_3) [2];
  ulong uVar8;
  string packing_offset;
  Bitset memberflags;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  uint64_t local_70;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  ts_3 = (char (*) [2])CONCAT44(in_register_0000008c,base_offset);
  pSVar5 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + member_type_id);
  local_70 = 0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  __k = &(type->super_IVariant).self;
  pmVar6 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,__k);
  uVar8 = (ulong)index;
  if (uVar8 < (pmVar6->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size) {
    pDVar2 = (pmVar6->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
    pBVar7 = &pDVar2[uVar8].decoration_flags;
    local_70 = pBVar7->lower;
    if (pBVar7 != (Bitset *)&local_70) {
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_68,&pDVar2[uVar8].decoration_flags.higher._M_h);
    }
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  SVar1 = type->storage;
  bVar3 = Compiler::has_extended_decoration
                    ((Compiler *)this,(type->super_IVariant).self.id,
                     SPIRVCrossDecorationExplicitOffset);
  if (bVar3 || SVar1 == StorageClassPushConstant) {
    bVar3 = Compiler::has_member_decoration((Compiler *)this,(TypeID)__k->id,index,DecorationOffset)
    ;
    if (bVar3) {
      uVar4 = (pmVar6->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr[uVar8].offset -
              base_offset;
      if ((uVar4 & 3) != 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (this_00,"Cannot pack on tighter bounds than 4 bytes in HLSL.");
        *(undefined ***)this_00 = &PTR__runtime_error_0035fca8;
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_b0._M_dataplus._M_p._0_4_ = uVar4 >> 4;
      join<char_const(&)[16],unsigned_int,char_const*&,char_const(&)[2]>
                (&local_f0,(spirv_cross *)" : packoffset(c",(char (*) [16])&local_b0,
                 (uint *)((long)emit_struct_member::packing_swizzle + (ulong)(uVar4 & 0xc) * 2),
                 (char **)0x2bd856,ts_3);
      ::std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
    }
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x35])
            (&local_f0,this,type,(ulong)index);
  CompilerGLSL::to_member_name_abi_cxx11_(&local_90,&this->super_CompilerGLSL,type,index);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
            (&local_b0,this,pSVar5,&local_90,0);
  CompilerGLSL::
  statement<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
            (&this->super_CompilerGLSL,&local_f0,qualifier,&local_b0,&local_d0,
             (char (*) [2])0x2d6cfb);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_b0._M_dataplus._M_p._4_4_,(uint)local_b0._M_dataplus._M_p) !=
      &local_b0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_b0._M_dataplus._M_p._4_4_,(uint)local_b0._M_dataplus._M_p));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void CompilerHLSL::emit_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                      const string &qualifier, uint32_t base_offset)
{
	auto &membertype = get<SPIRType>(member_type_id);

	Bitset memberflags;
	auto &memb = ir.meta[type.self].members;
	if (index < memb.size())
		memberflags = memb[index].decoration_flags;

	string packing_offset;
	bool is_push_constant = type.storage == StorageClassPushConstant;

	if ((has_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset) || is_push_constant) &&
	    has_member_decoration(type.self, index, DecorationOffset))
	{
		uint32_t offset = memb[index].offset - base_offset;
		if (offset & 3)
			SPIRV_CROSS_THROW("Cannot pack on tighter bounds than 4 bytes in HLSL.");

		static const char *packing_swizzle[] = { "", ".y", ".z", ".w" };
		packing_offset = join(" : packoffset(c", offset / 16, packing_swizzle[(offset & 15) >> 2], ")");
	}

	statement(layout_for_member(type, index), qualifier,
	          variable_decl(membertype, to_member_name(type, index)), packing_offset, ";");
}